

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O2

string * google::Munge(string *__return_storage_ptr__,string *filename)

{
  char *pcVar1;
  ostream *poVar2;
  int err;
  int err_00;
  int err_01;
  int err_02;
  int err_03;
  allocator<char> local_12aa;
  allocator<char> local_12a9;
  string *local_12a8;
  FILE *local_12a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1298;
  string local_1278;
  string line;
  char ptr_str [256];
  char null_str [256];
  char buf [4096];
  
  local_12a0 = fopen((filename->_M_dataplus)._M_p,"rb");
  if (local_12a0 != (FILE *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_12a8 = __return_storage_ptr__;
    while( true ) {
      pcVar1 = fgets(buf,0xfff,local_12a0);
      if (pcVar1 == (char *)0x0) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)null_str,buf,(allocator<char> *)ptr_str);
      MungeLine(&line,(string *)null_str);
      std::__cxx11::string::~string((string *)null_str);
      sprintf(null_str,"%p",0);
      sprintf(ptr_str,"%p",0x12345678);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1298,"__NULLP__",&local_12aa);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1278,null_str,&local_12a9)
      ;
      StringReplace(&line,&local_1298,&local_1278);
      std::__cxx11::string::~string((string *)&local_1278);
      std::__cxx11::string::~string((string *)&local_1298);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1298,"__PTRTEST__",&local_12aa);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1278,ptr_str,&local_12a9);
      StringReplace(&line,&local_1298,&local_1278);
      std::__cxx11::string::~string((string *)&local_1278);
      std::__cxx11::string::~string((string *)&local_1298);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1298,"__SUCCESS__",&local_12aa);
      StrError_abi_cxx11_(&local_1278,(google *)0x0,err);
      StringReplace(&line,&local_1298,&local_1278);
      std::__cxx11::string::~string((string *)&local_1278);
      std::__cxx11::string::~string((string *)&local_1298);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1298,"__ENOENT__",&local_12aa);
      StrError_abi_cxx11_(&local_1278,(google *)0x2,err_00);
      StringReplace(&line,&local_1298,&local_1278);
      std::__cxx11::string::~string((string *)&local_1278);
      std::__cxx11::string::~string((string *)&local_1298);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1298,"__EINTR__",&local_12aa);
      StrError_abi_cxx11_(&local_1278,(google *)0x4,err_01);
      StringReplace(&line,&local_1298,&local_1278);
      std::__cxx11::string::~string((string *)&local_1278);
      std::__cxx11::string::~string((string *)&local_1298);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1298,"__ENXIO__",&local_12aa);
      StrError_abi_cxx11_(&local_1278,(google *)0x6,err_02);
      StringReplace(&line,&local_1298,&local_1278);
      std::__cxx11::string::~string((string *)&local_1278);
      std::__cxx11::string::~string((string *)&local_1298);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1298,"__ENOEXEC__",&local_12aa);
      StrError_abi_cxx11_(&local_1278,(google *)0x8,err_03);
      StringReplace(&line,&local_1298,&local_1278);
      std::__cxx11::string::~string((string *)&local_1278);
      std::__cxx11::string::~string((string *)&local_1298);
      std::operator+(&local_1298,&line,"\n");
      std::__cxx11::string::append((string *)local_12a8);
      std::__cxx11::string::~string((string *)&local_1298);
      std::__cxx11::string::~string((string *)&line);
    }
    fclose(local_12a0);
    return local_12a8;
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)buf,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
             ,0x1be);
  poVar2 = LogMessage::stream((LogMessage *)buf);
  poVar2 = std::operator<<(poVar2,"Check failed: fp != NULL ");
  poVar2 = std::operator<<(poVar2,(string *)filename);
  std::operator<<(poVar2,": couldn\'t open");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)buf);
}

Assistant:

static inline string Munge(const string& filename) {
  FILE* fp = fopen(filename.c_str(), "rb");
  CHECK(fp != NULL) << filename << ": couldn't open";
  char buf[4096];
  string result;
  while (fgets(buf, 4095, fp)) {
    string line = MungeLine(buf);
    char null_str[256];
    char ptr_str[256];
    sprintf(null_str, "%p", static_cast<void*>(NULL));
    sprintf(ptr_str, "%p", reinterpret_cast<void*>(PTR_TEST_VALUE));

    StringReplace(&line, "__NULLP__", null_str);
    StringReplace(&line, "__PTRTEST__", ptr_str);

    StringReplace(&line, "__SUCCESS__", StrError(0));
    StringReplace(&line, "__ENOENT__", StrError(ENOENT));
    StringReplace(&line, "__EINTR__", StrError(EINTR));
    StringReplace(&line, "__ENXIO__", StrError(ENXIO));
    StringReplace(&line, "__ENOEXEC__", StrError(ENOEXEC));
    result += line + "\n";
  }
  fclose(fp);
  return result;
}